

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_iterator.hpp
# Opt level: O2

void __thiscall
boost::spirit::classic::
position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>
::position_iterator<char_const*>
          (position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>
           *this,file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>
                 *begin,
          file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_> *end
          ,char *fileName)

{
  allocator<char> local_41;
  string local_40 [32];
  
  fileiter_impl::mmap_file_iterator<char>::mmap_file_iterator
            ((mmap_file_iterator<char> *)this,(mmap_file_iterator<char> *)begin);
  *(undefined4 *)(this + 0x18) = 4;
  fileiter_impl::mmap_file_iterator<char>::mmap_file_iterator
            ((mmap_file_iterator<char> *)(this + 0x20),(mmap_file_iterator<char> *)end);
  std::__cxx11::string::string<std::allocator<char>>(local_40,fileName,&local_41);
  std::__cxx11::string::string((string *)(this + 0x38),local_40);
  *(undefined8 *)(this + 0x58) = 0x100000001;
  std::__cxx11::string::~string(local_40);
  this[0x60] = (position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>
                )((begin->super_type).m_iterator.m_curChar == (end->super_type).m_iterator.m_curChar
                 );
  return;
}

Assistant:

position_iterator(
        const ForwardIteratorT& begin,
        const ForwardIteratorT& end,
        FileNameT fileName)
    :   base_t(begin), _end(end), _pos(PositionT(fileName)),
        _isend(begin == end)
    {}